

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O0

int __thiscall
ylt::metric::detail::summary_impl<unsigned_long,_6UL>::stat
          (summary_impl<unsigned_long,_6UL> *this,char *__file,stat *__buf)

{
  bool bVar1;
  ushort uVar2;
  int16_t iVar3;
  uint uVar4;
  reference pdVar5;
  double *pdVar6;
  unsigned_long *puVar7;
  unsigned_long uVar8;
  unsigned_long *in_RCX;
  EVP_PKEY_CTX *ctx;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  summary_impl<unsigned_long,_6UL> *unaff_retaddr;
  unsigned_long tmp;
  double target_count;
  double e;
  iterator __end3;
  iterator __begin3;
  vector<double,_std::allocator<double>_> *__range3;
  float v;
  uint64_t count_now;
  data_t *ar [2];
  data_copy_t data_copy;
  vector<float,_std::allocator<float>_> *result;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  allocator_type *in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe80;
  undefined2 in_stack_fffffffffffffe84;
  uint16_t in_stack_fffffffffffffe86;
  undefined2 in_stack_fffffffffffffe88;
  undefined2 in_stack_fffffffffffffe8a;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  undefined2 in_stack_fffffffffffffe9c;
  undefined2 in_stack_fffffffffffffe9e;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffea0;
  unsigned_long local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double *local_e0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_d8;
  undefined8 local_d0;
  float local_c4;
  undefined1 local_bd;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined4 local_ac;
  undefined8 local_a8;
  long local_a0;
  allocator<float> local_95;
  undefined4 local_94;
  undefined4 local_90;
  allocator<float> local_7d;
  undefined4 local_7c;
  __pointer_type local_78;
  __pointer_type local_70;
  undefined1 local_60 [64];
  unsigned_long *local_20;
  stat *local_18;
  char *local_10;
  summary_impl<unsigned_long,_6UL> *local_8;
  
  local_20 = in_RCX;
  local_18 = __buf;
  local_10 = __file;
  local_8 = this;
  refresh(unaff_retaddr);
  *local_20 = 0;
  local_18->st_dev = 0;
  data_copy_t::data_copy_t
            ((data_copy_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  std::array<std::atomic<ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_t_*>,_2UL>::
  operator[]((array<std::atomic<ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_t_*>,_2UL>
              *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             (size_type)in_stack_fffffffffffffe68);
  local_78 = std::atomic::operator_cast_to_data_t_
                       ((atomic<ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_t_*> *)
                        0x1c04f1);
  std::array<std::atomic<ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_t_*>,_2UL>::
  operator[]((array<std::atomic<ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_t_*>,_2UL>
              *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             (size_type)in_stack_fffffffffffffe68);
  local_70 = std::atomic::operator_cast_to_data_t_
                       ((atomic<ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_t_*> *)
                        0x1c0517);
  if ((local_78 == (data_t *)0x0) && (local_70 == (__pointer_type)0x0)) {
    std::vector<double,_std::allocator<double>_>::size
              (*(vector<double,_std::allocator<double>_> **)(__file + 0x10));
    local_7c = 0;
    std::allocator<float>::allocator((allocator<float> *)0x1c0570);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               CONCAT44(in_stack_fffffffffffffe8c,
                        CONCAT22(in_stack_fffffffffffffe8a,in_stack_fffffffffffffe88)),
               (value_type_conflict4 *)
               CONCAT26(in_stack_fffffffffffffe86,
                        CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)),
               in_stack_fffffffffffffe78);
    std::allocator<float>::~allocator(&local_7d);
  }
  else {
    if (local_78 != (data_t *)0x0) {
      data_t::stat(local_78,(char *)local_20,(stat *)local_60);
    }
    if (local_70 != (data_t *)0x0) {
      data_t::stat(local_70,(char *)local_20,(stat *)(local_60 + 0x18));
    }
    if (*local_20 == 0) {
      std::vector<double,_std::allocator<double>_>::size
                (*(vector<double,_std::allocator<double>_> **)(__file + 0x10));
      local_94 = 0;
      std::allocator<float>::allocator((allocator<float> *)0x1c0687);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 CONCAT44(in_stack_fffffffffffffe8c,
                          CONCAT22(in_stack_fffffffffffffe8a,in_stack_fffffffffffffe88)),
                 (value_type_conflict4 *)
                 CONCAT26(in_stack_fffffffffffffe86,
                          CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)),
                 in_stack_fffffffffffffe78);
      std::allocator<float>::~allocator(&local_95);
    }
    else {
      local_a0 = 0;
      local_a8 = 0x2000;
      local_ac = 0;
      std::vector<std::pair<short,unsigned_long>,std::allocator<std::pair<short,unsigned_long>>>::
      emplace_back<unsigned_long,int>
                ((vector<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>
                  *)CONCAT26(in_stack_fffffffffffffe86,
                             CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)),
                 (unsigned_long *)in_stack_fffffffffffffe78,
                 (int *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      local_b8 = 0x2000;
      local_bc = 0;
      ctx = (EVP_PKEY_CTX *)&local_b8;
      std::vector<std::pair<short,unsigned_long>,std::allocator<std::pair<short,unsigned_long>>>::
      emplace_back<unsigned_long,int>
                ((vector<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>
                  *)CONCAT26(in_stack_fffffffffffffe86,
                             CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)),
                 (unsigned_long *)in_stack_fffffffffffffe78,
                 (int *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      data_copy_t::init((data_copy_t *)local_60,ctx);
      local_bd = 0;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x1c0781);
      std::vector<double,_std::allocator<double>_>::size
                (*(vector<double,_std::allocator<double>_> **)(__file + 0x10));
      std::vector<float,_std::allocator<float>_>::reserve
                (in_stack_fffffffffffffea0,
                 CONCAT26(in_stack_fffffffffffffe9e,
                          CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)));
      local_c4 = -1.8446744e+19;
      local_d0 = *(undefined8 *)(__file + 0x10);
      local_d8._M_current =
           (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe68);
      local_e0 = (double *)
                 std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe68);
      while (bVar1 = __gnu_cxx::operator==<double_*,_std::vector<double,_std::allocator<double>_>_>
                               ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffe68), ((bVar1 ^ 0xffU) & 1) != 0) {
        pdVar5 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_d8);
        local_e8 = *pdVar5;
        uVar4 = std::isnan(local_e8);
        if (((uVar4 & 1) != 0) || (local_e8 < 0.0)) {
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT26(in_stack_fffffffffffffe86,
                              CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)),
                     (value_type_conflict4 *)in_stack_fffffffffffffe78);
        }
        else {
          if (1.0 < local_e8) {
            local_e8 = 1.0;
          }
          uVar8 = *local_20;
          auVar12._8_4_ = (int)(uVar8 >> 0x20);
          auVar12._0_8_ = uVar8;
          auVar12._12_4_ = 0x45300000;
          local_f8 = local_e8 *
                     ((auVar12._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0));
          uVar8 = *local_20;
          auVar9._8_4_ = (int)(uVar8 >> 0x20);
          auVar9._0_8_ = uVar8;
          auVar9._12_4_ = 0x45300000;
          local_100 = (auVar9._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
          pdVar6 = std::min<double>(&local_f8,&local_100);
          local_f0 = *pdVar6;
          if ((local_e8 == 0.0) && (!NAN(local_e8))) {
            local_108 = 1;
            puVar7 = std::min<unsigned_long>(&local_108,local_20);
            uVar8 = *puVar7;
            auVar10._8_4_ = (int)(uVar8 >> 0x20);
            auVar10._0_8_ = uVar8;
            auVar10._12_4_ = 0x45300000;
            local_f0 = (auVar10._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
          }
          while (auVar11._8_4_ = (int)((ulong)local_a0 >> 0x20), auVar11._0_8_ = local_a0,
                auVar11._12_4_ = 0x45300000,
                (auVar11._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_a0) - 4503599627370496.0) < local_f0) {
            uVar8 = data_copy_t::count((data_copy_t *)0x1c0a1e);
            local_a0 = local_a0 + uVar8;
            iVar3 = data_copy_t::value((data_copy_t *)0x1c0a5a);
            data_t::get_raw_index(iVar3);
            local_c4 = decode(0);
            local_18->st_dev =
                 (__dev_t)((double)local_18->st_dev + (double)(local_c4 * (float)uVar8));
            data_copy_t::inc((data_copy_t *)
                             CONCAT26(in_stack_fffffffffffffe86,
                                      CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80))
                            );
          }
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT26(in_stack_fffffffffffffe86,
                              CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)),
                     (value_type_conflict4 *)in_stack_fffffffffffffe78);
        }
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator++(&local_d8);
      }
      while (uVar2 = data_copy_t::value((data_copy_t *)0x1c0b48), uVar2 < 0x2000) {
        iVar3 = data_copy_t::value((data_copy_t *)0x1c0b71);
        in_stack_fffffffffffffe86 = data_t::get_raw_index(iVar3);
        in_stack_fffffffffffffe80 = decode(0);
        uVar8 = data_copy_t::count((data_copy_t *)0x1c0bae);
        local_18->st_dev =
             (__dev_t)((double)local_18->st_dev + (double)(in_stack_fffffffffffffe80 * (float)uVar8)
                      );
        data_copy_t::inc((data_copy_t *)
                         CONCAT26(in_stack_fffffffffffffe86,
                                  CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)));
      }
      local_bd = 1;
    }
  }
  local_90 = 1;
  data_copy_t::~data_copy_t
            ((data_copy_t *)
             CONCAT26(in_stack_fffffffffffffe86,
                      CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)));
  return (int)this;
}

Assistant:

std::vector<float> stat(double& sum, uint64_t& count) {
    refresh();
    count = 0;
    sum = 0;
    data_copy_t data_copy;
    {
      data_t* ar[2] = {data_[0], data_[1]};
      if (ar[0] == nullptr && ar[1] == nullptr) [[unlikely]] {
        return std::vector<float>(rate_.size(), 0.0f);
      }
      if (ar[0]) {
        ar[0]->stat(count, data_copy.arr[0]);
      }
      if (ar[1]) {
        ar[1]->stat(count, data_copy.arr[1]);
      }
    }
    if (count == 0) {
      return std::vector<float>(rate_.size(), 0);
    }
    uint64_t count_now = 0;
    data_copy.arr[0].emplace_back(bucket_size / 2, 0);
    data_copy.arr[1].emplace_back(bucket_size / 2, 0);
    data_copy.init();
    std::vector<float> result;
    result.reserve(rate_.size());
    float v = -float16_max;
    for (double e : rate_) {
      if (std::isnan(e) || e < 0) {
        result.push_back(v);
        continue;
      }
      else if (e > 1) [[unlikely]] {
        e = 1;
      }
      auto target_count = std::min<double>(e * count, count);
      if (e == 0) {
        target_count = std::min(uint64_t{1}, count);
      }
      while (true) {
        if (target_count <= count_now) [[unlikely]] {
          result.push_back(v);
          break;
        }
        auto tmp = data_copy.count();
        count_now += tmp;
        v = decode(data_t::get_raw_index(data_copy.value()));
        sum += v * tmp;
        data_copy.inc();
      }
    }
    while (data_copy.value() < bucket_size / 2) {
      sum +=
          decode(data_t::get_raw_index(data_copy.value())) * data_copy.count();
      data_copy.inc();
    }
    return result;
  }